

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall
QHttpThreadDelegate::sslErrorsSlot(QHttpThreadDelegate *this,QList<QSslError> *errors)

{
  long in_FS_OFFSET;
  bool ignoreAll;
  QArrayDataPointer<QSslError> local_88;
  char local_69;
  undefined1 *local_68;
  char *local_60;
  void *local_58;
  QList<QSslError> *pQStack_50;
  undefined1 **local_48;
  undefined1 **ppuStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)&local_88);
    local_58 = (void *)0x0;
    pQStack_50 = (QList<QSslError> *)&local_88;
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_58);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_88);
    local_60 = &local_69;
    local_69 = '\0';
    local_88.d = (Data *)0x0;
    local_88.ptr = (QSslError *)0x0;
    local_88.size = 0;
    local_48 = &local_60;
    ppuStack_40 = &local_68;
    local_58 = (void *)0x0;
    local_68 = (undefined1 *)&local_88;
    pQStack_50 = errors;
    QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_58);
    if (local_69 == '\x01') {
      QHttpNetworkReply::ignoreSslErrors(*(QHttpNetworkReply **)(this + 0x150));
    }
    if (local_88.size != 0) {
      QHttpNetworkReply::ignoreSslErrors
                (*(QHttpNetworkReply **)(this + 0x150),(QList<QSslError> *)&local_88);
    }
    QArrayDataPointer<QSslError>::~QArrayDataPointer(&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::sslErrorsSlot(const QList<QSslError> &errors)
{
    if (!httpReply)
        return;

    emit sslConfigurationChanged(httpReply->sslConfiguration());

    bool ignoreAll = false;
    QList<QSslError> specificErrors;
    emit sslErrors(errors, &ignoreAll, &specificErrors);
    if (ignoreAll)
        httpReply->ignoreSslErrors();
    if (!specificErrors.isEmpty())
        httpReply->ignoreSslErrors(specificErrors);
}